

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O2

void __thiscall
CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
          (CBlockHeaderAndShortTxIDs *this,CBlock *block,uint64_t nonce)

{
  pointer psVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uint64_t uVar6;
  long lVar7;
  CBlock *pCVar8;
  CBlockHeader *pCVar9;
  size_t i;
  ulong uVar10;
  long in_FS_OFFSET;
  byte bVar11;
  PrefilledTransaction local_50;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->nonce = nonce;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->shorttxids,
             ((long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1,(allocator_type *)&local_50)
  ;
  uVar10 = 1;
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::vector
            (&this->prefilledtxn,1,(allocator_type *)&local_50);
  pCVar8 = block;
  pCVar9 = &this->header;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar2 = (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0];
    uVar3 = (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1];
    uVar4 = (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2];
    uVar5 = (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3];
    pCVar9->nVersion = (pCVar8->super_CBlockHeader).nVersion;
    (pCVar9->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = uVar2;
    (pCVar9->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = uVar3;
    (pCVar9->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = uVar4;
    (pCVar9->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = uVar5;
    pCVar8 = (CBlock *)((long)pCVar8 + (ulong)bVar11 * -0x10 + 8);
    pCVar9 = (CBlockHeader *)((long)pCVar9 + (ulong)bVar11 * -0x10 + 8);
  }
  FillShortTxIDSelector(this);
  local_50.index = 0;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             &((block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  PrefilledTransaction::operator=
            ((this->prefilledtxn).
             super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl
             .super__Vector_impl_data._M_start,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  lVar7 = 0;
  while( true ) {
    psVar1 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(block->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar10)
    break;
    uVar6 = GetShortID(this,(Wtxid *)(*(long *)((long)&psVar1[1].
                                                                                                              
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + lVar7 * 2) + 0x59));
    *(uint64_t *)
     ((long)(this->shorttxids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar7) = uVar6;
    uVar10 = uVar10 + 1;
    lVar7 = lVar7 + 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs(const CBlock& block, const uint64_t nonce) :
        nonce(nonce),
        shorttxids(block.vtx.size() - 1), prefilledtxn(1), header(block) {
    FillShortTxIDSelector();
    //TODO: Use our mempool prior to block acceptance to predictively fill more than just the coinbase
    prefilledtxn[0] = {0, block.vtx[0]};
    for (size_t i = 1; i < block.vtx.size(); i++) {
        const CTransaction& tx = *block.vtx[i];
        shorttxids[i - 1] = GetShortID(tx.GetWitnessHash());
    }
}